

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter_impl.h
# Opt level: O0

void __thiscall
lwlog::details::formatter::format_attribute<std::basic_string_view<char,std::char_traits<char>>>
          (formatter *this,string *pattern,flag_pair *flags,
          basic_string_view<char,_std::char_traits<char>_> value)

{
  undefined8 this_00;
  const_pointer pvVar1;
  char *pcVar2;
  _If_sv<std::basic_string_view<char>,_size_type> _Var3;
  string *psVar4;
  string_view *verbose;
  allocator<char> local_51;
  anon_class_8_1_a8c68091 local_50;
  string local_48 [8];
  string str_value;
  flag_pair *flags_local;
  string *pattern_local;
  basic_string_view<char,_std::char_traits<char>_> value_local;
  
  value_local._M_len = value._M_len;
  local_50.value = (basic_string_view<char,_std::char_traits<char>_> *)&pattern_local;
  str_value.field_2._8_8_ = pattern;
  pattern_local = (string *)flags;
  pvVar1 = format_attribute<std::basic_string_view<char,_std::char_traits<char>_>_>::
           anon_class_8_1_a8c68091::operator()(&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,pvVar1,&local_51);
  std::allocator<char>::~allocator(&local_51);
  this_00 = str_value.field_2._8_8_;
  while( true ) {
    pcVar2 = (char *)std::__cxx11::string::data();
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
    pcVar2 = strstr(pcVar2,pvVar1);
    if (pcVar2 == (char *)0x0) break;
    _Var3 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)this,(basic_string_view<char,_std::char_traits<char>_> *)this_00,0)
    ;
    psVar4 = (string *)
             std::basic_string_view<char,_std::char_traits<char>_>::length
                       ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
    std::__cxx11::string::replace((ulong)this,_Var3,psVar4);
  }
  while( true ) {
    pcVar2 = (char *)std::__cxx11::string::data();
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)(this_00 + 0x10));
    pcVar2 = strstr(pcVar2,pvVar1);
    if (pcVar2 == (char *)0x0) break;
    _Var3 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)this,
                       (basic_string_view<char,_std::char_traits<char>_> *)(this_00 + 0x10),0);
    psVar4 = (string *)
             std::basic_string_view<char,_std::char_traits<char>_>::length
                       ((basic_string_view<char,_std::char_traits<char>_> *)(this_00 + 0x10));
    std::__cxx11::string::replace((ulong)this,_Var3,psVar4);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void formatter::format_attribute(std::string& pattern, const flag_pair& flags, T value)
	{
		const std::string str_value = [&value]() {
			if constexpr (std::is_arithmetic_v<T>)					return std::to_string(value);
			else if constexpr (std::is_same_v<T, std::string>)		return value;
			else if constexpr (std::is_same_v<T, std::string_view>)	return value.data();
			else if constexpr (std::is_same_v<T, const char*>)		return value;
			else													return "";
		}();

		const auto& [verbose, shortened] = flags;
		while (std::strstr(pattern.data(), verbose.data()))
		{
			pattern.replace(pattern.find(verbose), verbose.length(), str_value);
		}

		while (std::strstr(pattern.data(), shortened.data()))
		{
			pattern.replace(pattern.find(shortened), shortened.length(), str_value);
		}
	}